

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

int mbedtls_mpi_add_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  ulong uVar1;
  mbedtls_mpi_uint *pmVar2;
  int iVar3;
  size_t nblimbs;
  ulong *puVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  bVar8 = X == B;
  if (bVar8) {
    B = A;
  }
  if ((A != X && !bVar8) && (iVar3 = mbedtls_mpi_copy(X,A), iVar3 != 0)) {
    return iVar3;
  }
  X->s = 1;
  lVar7 = B->n * -8;
  nblimbs = B->n;
  while ((nblimbs != 0 && (B->p[nblimbs - 1] == 0))) {
    lVar7 = lVar7 + 8;
    nblimbs = nblimbs - 1;
  }
  iVar3 = mbedtls_mpi_grow(X,nblimbs);
  if (iVar3 == 0) {
    lVar7 = -lVar7;
    pmVar2 = B->p;
    puVar4 = X->p;
    uVar6 = 0;
    for (sVar5 = 0; nblimbs != sVar5; sVar5 = sVar5 + 1) {
      uVar1 = *puVar4 + uVar6;
      uVar6 = (ulong)CARRY8(uVar1,pmVar2[sVar5]) + (ulong)CARRY8(uVar6,*puVar4);
      *puVar4 = uVar1 + pmVar2[sVar5];
      puVar4 = puVar4 + 1;
    }
    for (; uVar6 != 0; uVar6 = (ulong)CARRY8(uVar1,uVar6)) {
      if (X->n <= nblimbs) {
        iVar3 = mbedtls_mpi_grow(X,nblimbs + 1);
        if (iVar3 != 0) {
          return iVar3;
        }
        puVar4 = (ulong *)((long)X->p + lVar7);
      }
      uVar1 = *puVar4;
      *puVar4 = *puVar4 + uVar6;
      puVar4 = puVar4 + 1;
      lVar7 = lVar7 + 8;
      nblimbs = nblimbs + 1;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int mbedtls_mpi_add_abs( mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j;
    mbedtls_mpi_uint *o, *p, c, tmp;
    MPI_VALIDATE_RET( X != NULL );
    MPI_VALIDATE_RET( A != NULL );
    MPI_VALIDATE_RET( B != NULL );

    if( X == B )
    {
        const mbedtls_mpi *T = A; A = X; B = T;
    }

    if( X != A )
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( X, A ) );

    /*
     * X should always be positive as a result of unsigned additions.
     */
    X->s = 1;

    for( j = B->n; j > 0; j-- )
        if( B->p[j - 1] != 0 )
            break;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, j ) );

    o = B->p; p = X->p; c = 0;

    /*
     * tmp is used because it might happen that p == o
     */
    for( i = 0; i < j; i++, o++, p++ )
    {
        tmp= *o;
        *p +=  c; c  = ( *p <  c );
        *p += tmp; c += ( *p < tmp );
    }

    while( c != 0 )
    {
        if( i >= X->n )
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, i + 1 ) );
            p = X->p + i;
        }

        *p += c; c = ( *p < c ); i++; p++;
    }

cleanup:

    return( ret );
}